

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_math.cpp
# Opt level: O0

bool ON_TransformPointGrid
               (int dim,bool is_rat,int point_count0,int point_count1,int point_stride0,
               int point_stride1,double *point,ON_Xform *xform)

{
  bool bVar1;
  double *local_30;
  double *pt;
  int i;
  bool rc;
  int point_stride1_local;
  int point_stride0_local;
  int point_count1_local;
  int point_count0_local;
  bool is_rat_local;
  int dim_local;
  
  pt._7_1_ = false;
  local_30 = point;
  for (pt._0_4_ = 0; (int)pt < point_count0; pt._0_4_ = (int)pt + 1) {
    bVar1 = ON_TransformPointList(dim,is_rat,point_count1,point_stride1,local_30,xform);
    if (bVar1) {
      if ((int)pt == 0) {
        pt._7_1_ = true;
      }
    }
    else {
      pt._7_1_ = false;
    }
    local_30 = local_30 + point_stride0;
  }
  return pt._7_1_;
}

Assistant:

bool 
ON_TransformPointGrid(
                  int dim, bool is_rat, 
                  int point_count0, int point_count1,
                  int point_stride0, int point_stride1,
                  double* point,
                  const ON_Xform& xform
                  )
{
  bool rc = false;
  int i;
  double* pt = point;
  for ( i = 0; i < point_count0; i++ ) {
    if ( !ON_TransformPointList( dim, is_rat, point_count1, point_stride1, pt, xform ) ) {
      rc = false;
    }
    else if ( !i ) {
      rc = true;
    }
    pt += point_stride0;
  }
  return rc;
}